

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O0

int __thiscall IndexTree::rotateOnce(IndexTree *this,int32_t *root,int direction)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  Node *pNVar6;
  short local_62;
  int32_t *local_60;
  int32_t *local_58;
  int32_t *new_root_this_dir;
  Node *_new_root;
  int height_change;
  Node *_other_dir;
  int32_t *old_root_other_dir;
  Node *_old_root;
  int32_t old_root;
  int direction_local;
  int32_t *root_local;
  IndexTree *this_local;
  
  iVar2 = *root;
  pNVar5 = this->nodes;
  iVar3 = *root;
  if (direction == -1) {
    local_58 = &pNVar5[iVar3].right;
  }
  else {
    local_58 = &pNVar5[iVar3].left;
  }
  sVar1 = this->nodes[*local_58].balance_factor;
  *root = *local_58;
  pNVar6 = this->nodes;
  iVar4 = *root;
  if (direction == -1) {
    local_60 = &pNVar6[iVar4].left;
  }
  else {
    local_60 = &pNVar6[iVar4].right;
  }
  *local_58 = *local_60;
  *local_60 = iVar2;
  if (direction == -1) {
    local_62 = pNVar6[iVar4].balance_factor + -1;
    pNVar6[iVar4].balance_factor = local_62;
  }
  else {
    local_62 = pNVar6[iVar4].balance_factor + 1;
    pNVar6[iVar4].balance_factor = local_62;
  }
  pNVar5[iVar3].balance_factor = -local_62;
  return (uint)(sVar1 != 0);
}

Assistant:

int IndexTree::rotateOnce(int32_t &root, int direction) {
//    printf("Rotate once\n");
    auto old_root = root;
    auto &_old_root = nodes[root];
    auto &old_root_other_dir = direction == -1 ? _old_root.right : _old_root.left;
    auto &_other_dir = nodes[old_root_other_dir];

    int height_change = _other_dir.balance_factor == 0 ? 0 : 1;

    // do the rotation
    root = old_root_other_dir;
    auto &_new_root = nodes[root];
    auto &new_root_this_dir = direction == -1 ? _new_root.left : _new_root.right;
    old_root_other_dir = new_root_this_dir;
    new_root_this_dir = old_root;

    _old_root.balance_factor = -(direction == -1 ? --_new_root.balance_factor : ++_new_root.balance_factor);

    return height_change;
}